

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeSetHasContent(BtShared *pBt,Pgno pgno)

{
  u32 uVar1;
  Bitvec *pBVar2;
  int local_18;
  int rc;
  Pgno pgno_local;
  BtShared *pBt_local;
  
  local_18 = 0;
  if (pBt->pHasContent == (Bitvec *)0x0) {
    pBVar2 = sqlite3BitvecCreate(pBt->nPage);
    pBt->pHasContent = pBVar2;
    if (pBt->pHasContent == (Bitvec *)0x0) {
      local_18 = 7;
    }
  }
  if ((local_18 == 0) && (uVar1 = sqlite3BitvecSize(pBt->pHasContent), pgno <= uVar1)) {
    local_18 = sqlite3BitvecSet(pBt->pHasContent,pgno);
  }
  return local_18;
}

Assistant:

static int btreeSetHasContent(BtShared *pBt, Pgno pgno){
  int rc = SQLITE_OK;
  if( !pBt->pHasContent ){
    assert( pgno<=pBt->nPage );
    pBt->pHasContent = sqlite3BitvecCreate(pBt->nPage);
    if( !pBt->pHasContent ){
      rc = SQLITE_NOMEM_BKPT;
    }
  }
  if( rc==SQLITE_OK && pgno<=sqlite3BitvecSize(pBt->pHasContent) ){
    rc = sqlite3BitvecSet(pBt->pHasContent, pgno);
  }
  return rc;
}